

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  int *piVar1;
  int iVar2;
  global_State *pgVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  TString *pTVar7;
  uint uVar8;
  TString **ppTVar9;
  
  if (l < 0x29) {
    pgVar3 = L->l_G;
    uVar8 = pgVar3->seed ^ (uint)l;
    sVar6 = l;
    if (l != 0) {
      do {
        uVar8 = uVar8 ^ (uint)(byte)str[sVar6 - 1] + (uVar8 >> 2) + uVar8 * 0x20;
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
    }
    ppTVar9 = (pgVar3->strt).hash;
    iVar2 = (pgVar3->strt).size;
    uVar4 = iVar2 - 1U & uVar8;
    for (pTVar7 = ppTVar9[(int)uVar4]; pTVar7 != (TString *)0x0; pTVar7 = (pTVar7->u).hnext) {
      if ((pTVar7->shrlen == l) && (iVar5 = bcmp(str,pTVar7->contents,l), iVar5 == 0)) {
        if (((pgVar3->currentwhite ^ 0x18) & pTVar7->marked) == 0) {
          return pTVar7;
        }
        pTVar7->marked = pTVar7->marked ^ 0x18;
        return pTVar7;
      }
    }
    piVar1 = &(pgVar3->strt).nuse;
    iVar5 = (pgVar3->strt).nuse;
    if (iVar5 < iVar2) {
      ppTVar9 = ppTVar9 + (int)uVar4;
    }
    else {
      if (iVar5 == 0x7fffffff) {
        luaS_newlstr_cold_1();
      }
      iVar2 = (pgVar3->strt).size;
      if (iVar2 < 0x40000000) {
        luaS_resize(L,iVar2 * 2);
      }
      ppTVar9 = (pgVar3->strt).hash + ((long)(int)uVar8 & (long)(pgVar3->strt).size - 1U);
    }
    pTVar7 = (TString *)luaC_newobj(L,4,l + 0x19);
    pTVar7->hash = uVar8;
    pTVar7->extra = '\0';
    pTVar7->contents[l] = '\0';
    memcpy(pTVar7->contents,str,l);
    pTVar7->shrlen = (lu_byte)l;
    (pTVar7->u).hnext = *ppTVar9;
    *ppTVar9 = pTVar7;
    *piVar1 = *piVar1 + 1;
  }
  else {
    if (0x7fffffffffffffde < l) {
      luaM_toobig(L);
    }
    uVar8 = L->l_G->seed;
    pTVar7 = (TString *)luaC_newobj(L,0x14,l + 0x19);
    pTVar7->hash = uVar8;
    pTVar7->extra = '\0';
    pTVar7->contents[l] = '\0';
    (pTVar7->u).lnglen = l;
    memcpy(pTVar7->contents,str,l);
  }
  return pTVar7;
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    TString *ts;
    if (l_unlikely(l >= (MAX_SIZE - sizeof(TString))/sizeof(char)))
      luaM_toobig(L);
    ts = luaS_createlngstrobj(L, l);
    memcpy(getstr(ts), str, l * sizeof(char));
    return ts;
  }
}